

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * terminalName(void)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  int *lArray;
  char lShellName [64];
  char *local_10;
  
  memset(&lArray,0,0x40);
  lArray._0_1_ = 0x2a;
  if (terminalName::lTerminalName[0] == '*') {
    iVar1 = detectPresence("bash");
    if (iVar1 == 0) {
      pcVar2 = dialogNameOnly();
      sVar4 = strlen(pcVar2);
      if ((sVar4 == 0) && (iVar1 = whiptailPresentOnly(), iVar1 == 0)) {
        strcpy(terminalName::lTerminalName,"");
        return (char *)0x0;
      }
      strcpy((char *)&lArray,"sh -c ");
    }
    else {
      strcpy((char *)&lArray,"bash -c ");
    }
    iVar1 = isDarwin();
    if (iVar1 == 0) {
      pcVar2 = strcpy(terminalName::lTerminalName,"xterm");
      if ((pcVar2 == (char *)0x0) ||
         (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
        pcVar2 = strcpy(terminalName::lTerminalName,"terminator");
        if ((pcVar2 == (char *)0x0) ||
           (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
          pcVar2 = strcpy(terminalName::lTerminalName,"lxterminal");
          if ((pcVar2 == (char *)0x0) ||
             (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
            pcVar2 = strcpy(terminalName::lTerminalName,"konsole");
            if ((pcVar2 == (char *)0x0) ||
               (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
              pcVar2 = strcpy(terminalName::lTerminalName,"kterm");
              if ((pcVar2 == (char *)0x0) ||
                 (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                pcVar2 = strcpy(terminalName::lTerminalName,"tilix");
                if ((pcVar2 == (char *)0x0) ||
                   (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                  pcVar2 = strcpy(terminalName::lTerminalName,"xfce4-terminal");
                  if ((pcVar2 == (char *)0x0) ||
                     (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                    pcVar2 = strcpy(terminalName::lTerminalName,"mate-terminal");
                    if ((pcVar2 == (char *)0x0) ||
                       (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                      pcVar2 = strcpy(terminalName::lTerminalName,"Eterm");
                      if ((pcVar2 == (char *)0x0) ||
                         (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                        pcVar2 = strcpy(terminalName::lTerminalName,"evilvte");
                        if ((pcVar2 == (char *)0x0) ||
                           (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                          pcVar2 = strcpy(terminalName::lTerminalName,"pterm");
                          if ((pcVar2 == (char *)0x0) ||
                             (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
                            pcVar2 = strcpy(terminalName::lTerminalName,"gnome-terminal");
                            if ((pcVar2 == (char *)0x0) ||
                               (((iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0 ||
                                 (piVar3 = getMajorMinorPatch(terminalName::lTerminalName),
                                 piVar3 == (int *)0x0)) ||
                                ((2 < *piVar3 && ((*piVar3 != 3 || (6 < piVar3[1])))))))) {
                              strcpy(terminalName::lTerminalName,"");
                            }
                            else {
                              strcat(terminalName::lTerminalName," --disable-factory -x ");
                              strcat(terminalName::lTerminalName,(char *)&lArray);
                            }
                          }
                          else {
                            strcat(terminalName::lTerminalName," -e ");
                            strcat(terminalName::lTerminalName,(char *)&lArray);
                          }
                        }
                        else {
                          strcat(terminalName::lTerminalName," -e ");
                          strcat(terminalName::lTerminalName,(char *)&lArray);
                        }
                      }
                      else {
                        strcat(terminalName::lTerminalName," -e ");
                        strcat(terminalName::lTerminalName,(char *)&lArray);
                      }
                    }
                    else {
                      strcat(terminalName::lTerminalName," -x ");
                      strcat(terminalName::lTerminalName,(char *)&lArray);
                    }
                  }
                  else {
                    strcat(terminalName::lTerminalName," -x ");
                    strcat(terminalName::lTerminalName,(char *)&lArray);
                  }
                }
                else {
                  strcat(terminalName::lTerminalName," -e ");
                  strcat(terminalName::lTerminalName,(char *)&lArray);
                }
              }
              else {
                strcat(terminalName::lTerminalName," -e ");
                strcat(terminalName::lTerminalName,(char *)&lArray);
              }
            }
            else {
              strcat(terminalName::lTerminalName," -e ");
              strcat(terminalName::lTerminalName,(char *)&lArray);
            }
          }
          else {
            strcat(terminalName::lTerminalName," -e ");
            strcat(terminalName::lTerminalName,(char *)&lArray);
          }
        }
        else {
          strcat(terminalName::lTerminalName," -x ");
          strcat(terminalName::lTerminalName,(char *)&lArray);
        }
      }
      else {
        strcat(terminalName::lTerminalName,
               " -fa \'DejaVu Sans Mono\' -fs 10 -title tinyfiledialogs -e ");
        strcat(terminalName::lTerminalName,(char *)&lArray);
      }
    }
    else {
      pcVar2 = strcpy(terminalName::lTerminalName,"/opt/X11/bin/xterm");
      if ((pcVar2 == (char *)0x0) ||
         (iVar1 = detectPresence(terminalName::lTerminalName), iVar1 == 0)) {
        strcpy(terminalName::lTerminalName,"");
      }
      else {
        strcat(terminalName::lTerminalName,
               " -fa \'DejaVu Sans Mono\' -fs 10 -title tinyfiledialogs -e ");
        strcat(terminalName::lTerminalName,(char *)&lArray);
      }
    }
  }
  sVar4 = strlen(terminalName::lTerminalName);
  if (sVar4 == 0) {
    local_10 = (char *)0x0;
  }
  else {
    local_10 = terminalName::lTerminalName;
  }
  return local_10;
}

Assistant:

static char const * terminalName( )
{
        static char lTerminalName[128] = "*" ;
        char lShellName[64] = "*" ;
        int * lArray;

        if ( lTerminalName[0] == '*' )
        {
                if ( detectPresence( "bash" ) )
                {
                        strcpy(lShellName , "bash -c " ) ; /*good for basic input*/
                }
				else if ( strlen(dialogNameOnly()) || whiptailPresentOnly() )
				{
						strcpy(lShellName , "sh -c " ) ; /*good enough for dialog & whiptail*/
				}
				else
				{
					strcpy(lTerminalName , "" ) ;
					return NULL ;
				}

                if ( isDarwin() )
                {
                        if ( strcpy(lTerminalName , "/opt/X11/bin/xterm" )
                      && detectPresence( lTerminalName ) )
                        {
                                strcat(lTerminalName , " -fa 'DejaVu Sans Mono' -fs 10 -title tinyfiledialogs -e " ) ;
                                strcat(lTerminalName , lShellName ) ;
                        }
                        else
                        {
                                strcpy(lTerminalName , "" ) ;
                        }
                }
                else if ( strcpy(lTerminalName,"xterm") /*good (small without parameters)*/
                        && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -fa 'DejaVu Sans Mono' -fs 10 -title tinyfiledialogs -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"terminator") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"lxterminal") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"konsole") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"kterm") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"tilix") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"xfce4-terminal") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"mate-terminal") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"Eterm") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"evilvte") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"pterm") /*good (only letters)*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"gnome-terminal")
                && detectPresence(lTerminalName) && (lArray = getMajorMinorPatch(lTerminalName))
				&& ((lArray[0]<3) || (lArray[0]==3 && lArray[1]<=6)) )
                {
                        strcat(lTerminalName , " --disable-factory -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else
                {
                        strcpy(lTerminalName , "" ) ;
                }
                /* bad: koi rxterm guake tilda vala-terminal qterminal
                aterm Terminal terminology sakura lilyterm weston-terminal
                roxterm termit xvt rxvt mrxvt urxvt */
        }
        if ( strlen(lTerminalName) )
        {
                return lTerminalName ;
        }
        else
        {
                return NULL ;
        }
}